

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O3

void aom_comp_mask_pred_avx2
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined1 auVar1 [32];
  int iVar2;
  undefined1 (*pauVar3) [16];
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  
  iVar7 = ref_stride;
  iVar2 = width;
  pauVar3 = (undefined1 (*) [16])pred;
  if (invert_mask == 0) {
    iVar7 = width;
    iVar2 = ref_stride;
    pauVar3 = (undefined1 (*) [16])ref;
    ref = pred;
  }
  if (width == 8) {
    lVar5 = 0;
    auVar10[8] = 0x40;
    auVar10._0_8_ = 0x4040404040404040;
    auVar10[9] = 0x40;
    auVar10[10] = 0x40;
    auVar10[0xb] = 0x40;
    auVar10[0xc] = 0x40;
    auVar10[0xd] = 0x40;
    auVar10[0xe] = 0x40;
    auVar10[0xf] = 0x40;
    auVar13._8_2_ = 0x200;
    auVar13._0_8_ = 0x200020002000200;
    auVar13._10_2_ = 0x200;
    auVar13._12_2_ = 0x200;
    auVar13._14_2_ = 0x200;
    do {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)*pauVar3;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)*(undefined1 (*) [16])ref;
      auVar18 = vpunpcklbw_avx(auVar16,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)mask;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(*pauVar3 + iVar2);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(*(undefined1 (*) [16])ref + iVar7);
      auVar23 = vpunpcklbw_avx(auVar21,auVar23);
      auVar16 = vmovhps_avx(auVar19,*(undefined8 *)((long)mask + (long)mask_stride));
      auVar21 = vpsubb_avx(auVar10,auVar16);
      auVar19 = vpunpcklbw_avx(auVar19,auVar21);
      auVar18 = vpmaddubsw_avx(auVar18,auVar19);
      auVar16 = vpunpckhbw_avx(auVar16,auVar21);
      auVar16 = vpmaddubsw_avx(auVar23,auVar16);
      auVar18 = vpmulhrsw_avx(auVar18,auVar13);
      auVar16 = vpmulhrsw_avx(auVar16,auVar13);
      auVar16 = vpackuswb_avx(auVar18,auVar16);
      *(undefined1 (*) [16])(comp_pred + lVar5 * 8) = auVar16;
      pauVar3 = (undefined1 (*) [16])(*pauVar3 + iVar2 * 2);
      ref = *(undefined1 (*) [16])ref + iVar7 * 2;
      mask = (uint8_t *)((long)mask + (long)(mask_stride * 2));
      lVar5 = lVar5 + 2;
    } while ((int)lVar5 < height);
  }
  else if (width == 0x10) {
    lVar8 = (long)(iVar2 * 2);
    lVar5 = (long)(iVar7 * 2);
    lVar9 = (long)(mask_stride * 2);
    iVar6 = 0;
    auVar11[8] = 0x40;
    auVar11._0_8_ = 0x4040404040404040;
    auVar11[9] = 0x40;
    auVar11[10] = 0x40;
    auVar11[0xb] = 0x40;
    auVar11[0xc] = 0x40;
    auVar11[0xd] = 0x40;
    auVar11[0xe] = 0x40;
    auVar11[0xf] = 0x40;
    auVar11[0x10] = 0x40;
    auVar11[0x11] = 0x40;
    auVar11[0x12] = 0x40;
    auVar11[0x13] = 0x40;
    auVar11[0x14] = 0x40;
    auVar11[0x15] = 0x40;
    auVar11[0x16] = 0x40;
    auVar11[0x17] = 0x40;
    auVar11[0x18] = 0x40;
    auVar11[0x19] = 0x40;
    auVar11[0x1a] = 0x40;
    auVar11[0x1b] = 0x40;
    auVar11[0x1c] = 0x40;
    auVar11[0x1d] = 0x40;
    auVar11[0x1e] = 0x40;
    auVar11[0x1f] = 0x40;
    auVar14._8_2_ = 0x200;
    auVar14._0_8_ = 0x200020002000200;
    auVar14._10_2_ = 0x200;
    auVar14._12_2_ = 0x200;
    auVar14._14_2_ = 0x200;
    auVar14._16_2_ = 0x200;
    auVar14._18_2_ = 0x200;
    auVar14._20_2_ = 0x200;
    auVar14._22_2_ = 0x200;
    auVar14._24_2_ = 0x200;
    auVar14._26_2_ = 0x200;
    auVar14._28_2_ = 0x200;
    auVar14._30_2_ = 0x200;
    do {
      auVar17._0_16_ = ZEXT116(0) * *(undefined1 (*) [16])(*pauVar3 + iVar2) + ZEXT116(1) * *pauVar3
      ;
      auVar17._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar3 + iVar2);
      auVar20._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + iVar7) +
           ZEXT116(1) * *(undefined1 (*) [16])ref;
      auVar20._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + iVar7);
      auVar22._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride) +
           ZEXT116(1) * *(undefined1 (*) [16])mask;
      auVar22._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride);
      auVar24._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*pauVar3 + iVar2 + lVar8) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar3 + lVar8);
      auVar24._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar3 + iVar2 + lVar8);
      auVar25._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + iVar7 + lVar5) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar5);
      auVar25._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + iVar7 + lVar5);
      auVar26._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride + lVar9) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + lVar9);
      auVar26._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride + lVar9);
      pauVar3 = (undefined1 (*) [16])(*pauVar3 + lVar8 * 2);
      ref = *(undefined1 (*) [16])ref + lVar5 * 2;
      mask = *(undefined1 (*) [16])mask + lVar9 * 2;
      auVar15 = vpsubb_avx2(auVar11,auVar22);
      auVar12 = vpunpcklbw_avx2(auVar17,auVar20);
      auVar1 = vpunpcklbw_avx2(auVar22,auVar15);
      auVar12 = vpmaddubsw_avx2(auVar12,auVar1);
      auVar1 = vpunpckhbw_avx2(auVar17,auVar20);
      auVar15 = vpunpckhbw_avx2(auVar22,auVar15);
      auVar15 = vpmaddubsw_avx2(auVar1,auVar15);
      auVar12 = vpmulhrsw_avx2(auVar12,auVar14);
      auVar15 = vpmulhrsw_avx2(auVar15,auVar14);
      auVar12 = vpackuswb_avx2(auVar12,auVar15);
      *(undefined1 (*) [32])comp_pred = auVar12;
      auVar15 = vpsubb_avx2(auVar11,auVar26);
      auVar12 = vpunpcklbw_avx2(auVar24,auVar25);
      auVar1 = vpunpcklbw_avx2(auVar26,auVar15);
      auVar12 = vpmaddubsw_avx2(auVar12,auVar1);
      auVar1 = vpunpckhbw_avx2(auVar24,auVar25);
      auVar15 = vpunpckhbw_avx2(auVar26,auVar15);
      auVar15 = vpmaddubsw_avx2(auVar1,auVar15);
      auVar12 = vpmulhrsw_avx2(auVar12,auVar14);
      auVar15 = vpmulhrsw_avx2(auVar15,auVar14);
      auVar12 = vpackuswb_avx2(auVar12,auVar15);
      *(undefined1 (*) [32])((long)comp_pred + 0x20) = auVar12;
      comp_pred = (uint8_t *)((long)comp_pred + 0x40);
      iVar6 = iVar6 + 4;
    } while (iVar6 < height);
  }
  else {
    iVar6 = 1;
    if (1 < height) {
      iVar6 = height;
    }
    iVar4 = 0;
    auVar12[8] = 0x40;
    auVar12._0_8_ = 0x4040404040404040;
    auVar12[9] = 0x40;
    auVar12[10] = 0x40;
    auVar12[0xb] = 0x40;
    auVar12[0xc] = 0x40;
    auVar12[0xd] = 0x40;
    auVar12[0xe] = 0x40;
    auVar12[0xf] = 0x40;
    auVar12[0x10] = 0x40;
    auVar12[0x11] = 0x40;
    auVar12[0x12] = 0x40;
    auVar12[0x13] = 0x40;
    auVar12[0x14] = 0x40;
    auVar12[0x15] = 0x40;
    auVar12[0x16] = 0x40;
    auVar12[0x17] = 0x40;
    auVar12[0x18] = 0x40;
    auVar12[0x19] = 0x40;
    auVar12[0x1a] = 0x40;
    auVar12[0x1b] = 0x40;
    auVar12[0x1c] = 0x40;
    auVar12[0x1d] = 0x40;
    auVar12[0x1e] = 0x40;
    auVar12[0x1f] = 0x40;
    auVar15._8_2_ = 0x200;
    auVar15._0_8_ = 0x200020002000200;
    auVar15._10_2_ = 0x200;
    auVar15._12_2_ = 0x200;
    auVar15._14_2_ = 0x200;
    auVar15._16_2_ = 0x200;
    auVar15._18_2_ = 0x200;
    auVar15._20_2_ = 0x200;
    auVar15._22_2_ = 0x200;
    auVar15._24_2_ = 0x200;
    auVar15._26_2_ = 0x200;
    auVar15._28_2_ = 0x200;
    auVar15._30_2_ = 0x200;
    do {
      if (0 < width) {
        lVar5 = 0;
        do {
          auVar11 = vlddqu_avx(*(undefined1 (*) [32])(*pauVar3 + lVar5));
          auVar14 = vlddqu_avx(*(undefined1 (*) [32])(*(undefined1 (*) [16])ref + lVar5));
          auVar1 = vlddqu_avx(*(undefined1 (*) [32])(mask + lVar5));
          auVar20 = vpsubb_avx2(auVar12,auVar1);
          auVar17 = vpunpcklbw_avx2(auVar11,auVar14);
          auVar22 = vpunpcklbw_avx2(auVar1,auVar20);
          auVar17 = vpmaddubsw_avx2(auVar17,auVar22);
          auVar11 = vpunpckhbw_avx2(auVar11,auVar14);
          auVar14 = vpunpckhbw_avx2(auVar1,auVar20);
          auVar11 = vpmaddubsw_avx2(auVar11,auVar14);
          auVar14 = vpmulhrsw_avx2(auVar17,auVar15);
          auVar11 = vpmulhrsw_avx2(auVar11,auVar15);
          auVar11 = vpackuswb_avx2(auVar14,auVar11);
          *(undefined1 (*) [32])(comp_pred + lVar5) = auVar11;
          lVar5 = lVar5 + 0x20;
        } while (lVar5 < width);
        comp_pred = comp_pred + lVar5;
      }
      pauVar3 = (undefined1 (*) [16])(*pauVar3 + iVar2);
      ref = *(undefined1 (*) [16])ref + iVar7;
      mask = mask + mask_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar6);
  }
  return;
}

Assistant:

void aom_comp_mask_pred_avx2(uint8_t *comp_pred, const uint8_t *pred, int width,
                             int height, const uint8_t *ref, int ref_stride,
                             const uint8_t *mask, int mask_stride,
                             int invert_mask) {
  int i = 0;
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  if (width == 8) {
    comp_mask_pred_8_ssse3(comp_pred, height, src0, stride0, src1, stride1,
                           mask, mask_stride);
  } else if (width == 16) {
    do {
      const __m256i sA0 = mm256_loadu2(src0 + stride0, src0);
      const __m256i sA1 = mm256_loadu2(src1 + stride1, src1);
      const __m256i aA = mm256_loadu2(mask + mask_stride, mask);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      const __m256i sB0 = mm256_loadu2(src0 + stride0, src0);
      const __m256i sB1 = mm256_loadu2(src1 + stride1, src1);
      const __m256i aB = mm256_loadu2(mask + mask_stride, mask);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      // comp_pred's stride == width == 16
      comp_mask_pred_line_avx2(sA0, sA1, aA, comp_pred);
      comp_mask_pred_line_avx2(sB0, sB1, aB, comp_pred + 32);
      comp_pred += (16 << 2);
      i += 4;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        const __m256i sA0 = _mm256_lddqu_si256((const __m256i *)(src0 + x));
        const __m256i sA1 = _mm256_lddqu_si256((const __m256i *)(src1 + x));
        const __m256i aA = _mm256_lddqu_si256((const __m256i *)(mask + x));

        comp_mask_pred_line_avx2(sA0, sA1, aA, comp_pred);
        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i++;
    } while (i < height);
  }
}